

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::SparseNode::_InternalSerialize
          (SparseNode *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  double dVar1;
  uint uVar2;
  void *data;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  undefined8 *puVar8;
  size_t __n;
  
  puVar7 = target;
  if (this->index_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->index_;
    *target = '\b';
    target[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar7 = target + 2;
    }
    else {
      target[1] = (byte)uVar2 | 0x80;
      uVar4 = (ulong)(long)(int)uVar2 >> 7;
      target[2] = (uint8_t)uVar4;
      puVar7 = target + 3;
      if (0x3fff < uVar2) {
        uVar6 = (ulong)target[2];
        do {
          puVar7[-1] = (byte)uVar6 | 0x80;
          uVar5 = uVar4 >> 7;
          *puVar7 = (uint8_t)uVar5;
          puVar7 = puVar7 + 1;
          uVar6 = uVar5 & 0xffffffff;
          bVar3 = 0x3fff < uVar4;
          uVar4 = uVar5;
        } while (bVar3);
      }
    }
  }
  if (this->value_ != 0.0) {
    if (stream->end_ <= puVar7) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar7);
    }
    dVar1 = this->value_;
    *puVar7 = '\x11';
    *(double *)(puVar7 + 1) = dVar1;
    puVar7 = puVar7 + 9;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    data = *(void **)((uVar4 & 0xfffffffffffffffc) + 8);
    uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar4 & 1) == 0) {
      puVar8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar8 = (undefined8 *)((uVar4 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar8[1];
    if ((long)stream->end_ - (long)puVar7 < (long)__n) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar8[1],puVar7);
      return puVar7;
    }
    memcpy(puVar7,data,__n);
    puVar7 = puVar7 + __n;
  }
  return puVar7;
}

Assistant:

uint8_t* SparseNode::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.SparseNode)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 index = 1;
  if (this->_internal_index() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(1, this->_internal_index(), target);
  }

  // double value = 2;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_value = this->_internal_value();
  uint64_t raw_value;
  memcpy(&raw_value, &tmp_value, sizeof(tmp_value));
  if (raw_value != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(2, this->_internal_value(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.SparseNode)
  return target;
}